

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O3

void __thiscall
TArray<FLevelStatistics,_FLevelStatistics>::DoCopy
          (TArray<FLevelStatistics,_FLevelStatistics> *this,
          TArray<FLevelStatistics,_FLevelStatistics> *other)

{
  uint uVar1;
  FLevelStatistics *pFVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  FLevelStatistics *pFVar8;
  long lVar9;
  ulong uVar10;
  
  uVar1 = other->Count;
  this->Count = uVar1;
  this->Most = uVar1;
  if ((ulong)uVar1 == 0) {
    this->Array = (FLevelStatistics *)0x0;
  }
  else {
    pFVar8 = (FLevelStatistics *)
             M_Malloc_Dbg((ulong)uVar1 * 0x34,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/tarray.h"
                          ,0x199);
    this->Array = pFVar8;
    if (this->Count != 0) {
      lVar9 = 0;
      uVar10 = 0;
      do {
        pFVar8 = this->Array;
        pFVar2 = other->Array;
        *(undefined4 *)(pFVar8->name + lVar9 + 0xe) = *(undefined4 *)(pFVar2->name + lVar9 + 0xe);
        uVar3 = *(undefined8 *)(pFVar2->info + lVar9);
        uVar4 = *(undefined8 *)(pFVar2->info + lVar9 + 8);
        uVar5 = *(undefined8 *)(pFVar2->info + lVar9 + 0x10);
        uVar6 = *(undefined8 *)(pFVar2->info + lVar9 + 0x10 + 8);
        uVar7 = *(undefined8 *)(pFVar2->name + lVar9 + -2 + 8);
        *(undefined8 *)(pFVar8->name + lVar9 + -2) = *(undefined8 *)(pFVar2->name + lVar9 + -2);
        *(undefined8 *)(pFVar8->name + lVar9 + -2 + 8) = uVar7;
        *(undefined8 *)(pFVar8->info + lVar9 + 0x10) = uVar5;
        *(undefined8 *)(pFVar8->info + lVar9 + 0x10 + 8) = uVar6;
        *(undefined8 *)(pFVar8->info + lVar9) = uVar3;
        *(undefined8 *)(pFVar8->info + lVar9 + 8) = uVar4;
        uVar10 = uVar10 + 1;
        lVar9 = lVar9 + 0x34;
      } while (uVar10 < this->Count);
    }
  }
  return;
}

Assistant:

void DoCopy (const TArray<T> &other)
	{
		Most = Count = other.Count;
		if (Count != 0)
		{
			Array = (T *)M_Malloc (sizeof(T)*Most);
			for (unsigned int i = 0; i < Count; ++i)
			{
				::new(&Array[i]) T(other.Array[i]);
			}
		}
		else
		{
			Array = NULL;
		}
	}